

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O3

Query * reorder_subqueries(Query *__return_storage_ptr__,Query *q)

{
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> __seed;
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> __last;
  pointer pQVar1;
  pointer pQVar2;
  QueryType *pQVar3;
  vector<Query,_std::allocator<Query>_> *pvVar4;
  long lVar5;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>,_Query>
  local_40;
  
  pQVar3 = Query::get_type(q);
  if (*pQVar3 == AND) {
    pvVar4 = Query::as_queries(q);
    __seed._M_current =
         (pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data
         ._M_start;
    pvVar4 = Query::as_queries(q);
    __last._M_current =
         (pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data
         ._M_finish;
    if (__seed._M_current != __last._M_current) {
      lVar5 = ((long)__last._M_current - (long)__seed._M_current >> 3) * -0x71c71c71c71c71c7;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>,_Query>
      ::_Temporary_buffer(&local_40,__seed,(lVar5 - (lVar5 + 1 >> 0x3f)) + 1 >> 1);
      if (local_40._M_buffer == (Query *)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<Query*,std::vector<Query,std::allocator<Query>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Query_const&,Query_const&)>>
                  (__seed,__last,(_Iter_comp_iter<bool_(*)(const_Query_&,_const_Query_&)>)0x14af12);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<Query*,std::vector<Query,std::allocator<Query>>>,Query*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Query_const&,Query_const&)>>
                  (__seed,__last,local_40._M_buffer,local_40._M_len,
                   (_Iter_comp_iter<bool_(*)(const_Query_&,_const_Query_&)>)0x14af12);
      }
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>,_Query>
      ::~_Temporary_buffer(&local_40);
    }
  }
  __return_storage_ptr__->type = q->type;
  pQVar1 = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_start =
       (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_finish = pQVar1;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __return_storage_ptr__->count = q->count;
  __return_storage_ptr__->ngram = q->ngram;
  pQVar2 = (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_start =
       (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_finish = pQVar2;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Query reorder_subqueries(Query &&q) {
    if (q.get_type() == QueryType::AND) {
        std::stable_sort(q.as_queries().begin(), q.as_queries().end(),
                         query_heuristic_comparer);
    }
    return std::move(q);  // Currently only support AND operators.
}